

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O3

void glist_init(_glist *x)

{
  t_gstub *ptVar1;
  t_symbol **pptVar2;
  void *pvVar3;
  
  memset(&(x->gl_obj).te_g.g_next,0,0xf0);
  ptVar1 = gstub_new(x,(_array *)0x0);
  x->gl_stub = ptVar1;
  glist_valid = glist_valid + 1;
  x->gl_valid = glist_valid;
  pptVar2 = (t_symbol **)getbytes(0);
  x->gl_xlabel = pptVar2;
  pptVar2 = (t_symbol **)getbytes(0);
  x->gl_ylabel = pptVar2;
  pvVar3 = getbytes(0x20);
  x->gl_privatedata = pvVar3;
  return;
}

Assistant:

void glist_init(t_glist *x)
{
        /* zero out everyone except "pd" field */
    memset(((char *)x) + sizeof(x->gl_pd), 0, sizeof(*x) - sizeof(x->gl_pd));
    x->gl_stub = gstub_new(x, 0);
    x->gl_valid = ++glist_valid;
    x->gl_xlabel = (t_symbol **)t_getbytes(0);
    x->gl_ylabel = (t_symbol **)t_getbytes(0);
    x->gl_privatedata = getbytes(sizeof(t_canvas_private));
}